

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Directory.cpp
# Opt level: O1

int __thiscall Directory::mkdir(Directory *this,char *__path,__mode_t __mode)

{
  pointer pcVar1;
  bool bVar2;
  int iVar3;
  long *plVar4;
  int *piVar5;
  char *pcVar6;
  undefined7 extraout_var;
  long *plVar7;
  string fullPath;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  long *local_68;
  long local_58;
  long lStack_50;
  undefined1 *local_48 [2];
  undefined1 local_38 [16];
  
  pcVar1 = (this->path)._M_dataplus._M_p;
  local_48[0] = local_38;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_48,pcVar1,pcVar1 + (this->path)._M_string_length);
  std::__cxx11::string::append((char *)local_48);
  plVar4 = (long *)std::__cxx11::string::_M_append((char *)local_48,*(ulong *)__path);
  plVar7 = plVar4 + 2;
  if ((long *)*plVar4 == plVar7) {
    local_58 = *plVar7;
    lStack_50 = plVar4[3];
    local_68 = &local_58;
  }
  else {
    local_58 = *plVar7;
    local_68 = (long *)*plVar4;
  }
  *plVar4 = (long)plVar7;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  if (local_48[0] != local_38) {
    operator_delete(local_48[0]);
  }
  iVar3 = ::mkdir((char *)local_68,__mode & 0x1ff ^ 0x41ff);
  if (iVar3 == 0) {
    bVar2 = refresh(this);
    iVar3 = (int)CONCAT71(extraout_var,bVar2);
  }
  else {
    piVar5 = __errno_location();
    pcVar6 = strerror(*piVar5);
    iVar3 = 0;
    softHSMLog(3,"mkdir",
               "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/object_store/Directory.cpp"
               ,0xee,"Failed to create the directory (%s): %s",pcVar6,local_68);
  }
  if (local_68 != &local_58) {
    operator_delete(local_68);
  }
  return iVar3;
}

Assistant:

bool Directory::mkdir(std::string name, int umask)
{
	std::string fullPath = path + OS_PATHSEP + name;

#ifndef _WIN32
	int rv = ::mkdir(fullPath.c_str(), S_IFDIR | ((S_IRWXU | S_IRWXG | S_IRWXO) & ~umask));
#else
	(void)umask;
	int rv = _mkdir(fullPath.c_str());
#endif

	if (rv != 0)
	{
		ERROR_MSG("Failed to create the directory (%s): %s", strerror(errno), fullPath.c_str());

		return false;
	}

	return refresh();
}